

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QList<QString> * __thiscall
QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
::keys(QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
       *this)

{
  long lVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  back_insert_iterator<QList<QString>_> bVar4;
  QList<QString> *in_RSI;
  map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  QList<QString> *result;
  anon_class_1_0_00000001 extractKey;
  QList<QString> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&(in_RDI->_M_t)._M_impl = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x2e4290);
  std::
  map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>::
  size((map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
        *)0x2e429e);
  QList<QString>::reserve(in_stack_ffffffffffffffc8,in_stack_00000008);
  cVar2 = std::
          map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
          ::cbegin(in_RDI);
  cVar3 = std::
          map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
          ::cend(in_RDI);
  bVar4 = std::back_inserter<QList<QString>>(in_RSI);
  std::
  transform<std::_Rb_tree_const_iterator<std::pair<QString_const,QString>>,std::back_insert_iterator<QList<QString>>,QMapData<std::map<QString,QString,std::less<QString>,std::allocator<std::pair<QString_const,QString>>>>::keys()const::_lambda(auto:1_const&)_1_>
            (cVar2._M_node,cVar3._M_node,bVar4.container);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<QString> *)in_RDI;
}

Assistant:

QList<Key> keys() const
    {
        QList<Key> result;
        result.reserve(m.size());

        const auto extractKey = [](const auto &v) { return v.first; };

        std::transform(m.cbegin(),
                       m.cend(),
                       std::back_inserter(result),
                       extractKey);
        return result;
    }